

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall QMenu::isTearOffMenuVisible(QMenu *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar2 = *(long *)(lVar1 + 0x318);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (lVar1 = *(long *)(lVar1 + 800), lVar1 != 0))
  {
    return (bool)(*(byte *)(*(long *)(lVar1 + 0x20) + 9) >> 7);
  }
  return false;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }